

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

bool __thiscall
Highs::validLinearObjective(Highs *this,HighsLinearObjective *linear_objective,HighsInt iObj)

{
  HighsLinearObjective *pHVar1;
  bool bVar2;
  size_type sVar3;
  int in_EDX;
  long in_RSI;
  HighsLinearObjective *in_RDI;
  HighsInt linear_objective_coefficients_size;
  char *local_70;
  Highs *in_stack_ffffffffffffffa8;
  bool local_41;
  string local_40 [28];
  int in_stack_ffffffffffffffdc;
  bool local_1;
  
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x10));
  if ((int)sVar3 == in_RDI[4].priority) {
    if ((((ulong)in_RDI[0x32].abs_tolerance & 0x100000000) == 0) &&
       (bVar2 = hasRepeatedLinearObjectivePriorities(in_stack_ffffffffffffffa8,in_RDI), bVar2)) {
      highsLogUser((HighsLogOptions *)&in_RDI[0x38].abs_tolerance,kError,
                   "Repeated priorities for lexicographic optimization is illegal\n");
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    pHVar1 = in_RDI + 0x38;
    if (in_EDX < 0) {
      local_70 = "";
    }
    else {
      std::__cxx11::to_string(in_stack_ffffffffffffffdc);
      local_70 = (char *)std::__cxx11::string::c_str();
    }
    local_41 = in_EDX >= 0;
    highsLogUser((HighsLogOptions *)&pHVar1->abs_tolerance,kError,
                 "Coefficient vector for linear objective %s has size %d != %d = lp.num_col_\n",
                 local_70,sVar3 & 0xffffffff,(ulong)(uint)in_RDI[4].priority);
    if (local_41) {
      std::__cxx11::string::~string(local_40);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Highs::validLinearObjective(const HighsLinearObjective& linear_objective,
                                 const HighsInt iObj) const {
  HighsInt linear_objective_coefficients_size =
      linear_objective.coefficients.size();
  if (linear_objective_coefficients_size != this->model_.lp_.num_col_) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Coefficient vector for linear objective %s has size %d != %d = "
        "lp.num_col_\n",
        iObj >= 0 ? std::to_string(iObj).c_str() : "",
        int(linear_objective_coefficients_size),
        int(this->model_.lp_.num_col_));
    return false;
  }
  if (!options_.blend_multi_objectives &&
      hasRepeatedLinearObjectivePriorities(&linear_objective)) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Repeated priorities for lexicographic optimization is illegal\n");
    return false;
  }
  return true;
}